

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapNonMessageNonStringField
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  string_view str;
  LogMessage local_40;
  CppType local_2c;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    Reflection::VerifyFieldType<int>(r,field);
    puVar4 = (undefined4 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<int>(r,field);
    goto LAB_0041eb58;
  case 2:
    Reflection::VerifyFieldType<long>(r,field);
    puVar8 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<long>(r,field);
    goto LAB_0041eb10;
  case 3:
    Reflection::VerifyFieldType<unsigned_int>(r,field);
    puVar4 = (undefined4 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<unsigned_int>(r,field);
LAB_0041eb58:
    puVar5 = (undefined4 *)Reflection::MutableRawImpl(r,rhs,field);
    uVar3 = *puVar4;
    *puVar4 = *puVar5;
    *puVar5 = uVar3;
    break;
  case 4:
    Reflection::VerifyFieldType<unsigned_long>(r,field);
    puVar8 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<unsigned_long>(r,field);
LAB_0041eb10:
    puVar9 = (undefined8 *)Reflection::MutableRawImpl(r,rhs,field);
    uVar1 = *puVar8;
    *puVar8 = *puVar9;
    *puVar9 = uVar1;
    break;
  case 5:
    Reflection::VerifyFieldType<double>(r,field);
    puVar8 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<double>(r,field);
    puVar9 = (undefined8 *)Reflection::MutableRawImpl(r,rhs,field);
    uVar1 = *puVar8;
    *puVar8 = *puVar9;
    *puVar9 = uVar1;
    break;
  case 6:
    Reflection::VerifyFieldType<float>(r,field);
    puVar4 = (undefined4 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<float>(r,field);
    puVar5 = (undefined4 *)Reflection::MutableRawImpl(r,rhs,field);
    uVar3 = *puVar4;
    *puVar4 = *puVar5;
    *puVar5 = uVar3;
    break;
  case 7:
    Reflection::VerifyFieldType<bool>(r,field);
    puVar6 = (undefined1 *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<bool>(r,field);
    puVar7 = (undefined1 *)Reflection::MutableRawImpl(r,rhs,field);
    uVar2 = *puVar6;
    *puVar6 = *puVar7;
    *puVar7 = uVar2;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x370);
    str._M_str = "Unimplemented type: ";
    str._M_len = 0x14;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    local_2c = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    absl::lts_20250127::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(&local_40,&local_2c);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapNonMessageNonStringField(
    const Reflection* r, Message* lhs, Message* rhs,
    const FieldDescriptor* field) {
  switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)               \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:       \
    std::swap(*r->MutableRaw<TYPE>(lhs, field),  \
              *r->MutableRaw<TYPE>(rhs, field)); \
    break;

    SWAP_VALUES(INT32, int32_t);
    SWAP_VALUES(INT64, int64_t);
    SWAP_VALUES(UINT32, uint32_t);
    SWAP_VALUES(UINT64, uint64_t);
    SWAP_VALUES(FLOAT, float);
    SWAP_VALUES(DOUBLE, double);
    SWAP_VALUES(BOOL, bool);
    SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}